

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O3

void __thiscall
slang::parsing::Preprocessor::applyProtectPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma,
          SmallVectorBase<slang::parsing::Token> *skippedTokens)

{
  TokenKind kind;
  size_t sVar1;
  bool bVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  SourceLocation SVar4;
  SyntaxNode *pSVar5;
  SyntaxNode *pSVar6;
  long lVar7;
  SimplePragmaExpressionSyntax *simple;
  ulong uVar9;
  Token keyword;
  SourceRange range;
  string_view sVar10;
  anon_class_16_2_cfeedcd7 handle;
  Token local_40;
  undefined8 uVar8;
  
  sVar1 = (pragma->args).elements._M_extent._M_extent_value;
  if (sVar1 == 0) {
    local_40 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)pragma);
    SVar4 = Token::location(&local_40);
    sVar10 = Token::rawText(&local_40);
    addDiag(this,(DiagCode)0x200004,(SourceLocation)((long)SVar4 + sVar10._M_len * 0x10000000));
  }
  else {
    local_40.info = (Info *)skippedTokens;
    local_40._0_8_ = this;
    uVar9 = sVar1 + 1;
    if (1 < uVar9) {
      uVar9 = uVar9 >> 1;
      lVar7 = 0;
      do {
        ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((pragma->args).elements._M_ptr)->super_ConstTokenOrSyntax).
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar7));
        pSVar5 = *ppSVar3;
        if (pSVar5->kind == NameValuePragmaExpression) {
          uVar8 = *(undefined8 *)(pSVar5 + 1);
          pSVar6 = pSVar5[1].parent;
          pSVar5 = pSVar5[2].parent;
LAB_001c3fc1:
          keyword.info = (Info *)pSVar6;
          keyword.kind = (short)uVar8;
          keyword._2_1_ = (char)((ulong)uVar8 >> 0x10);
          keyword.numFlags.raw = (char)((ulong)uVar8 >> 0x18);
          keyword.rawLen = (int)((ulong)uVar8 >> 0x20);
          applyProtectPragma::anon_class_16_2_cfeedcd7::operator()
                    ((anon_class_16_2_cfeedcd7 *)&local_40,keyword,(PragmaExpressionSyntax *)pSVar5)
          ;
        }
        else {
          if ((pSVar5->kind == SimplePragmaExpression) &&
             ((kind = (TokenKind)pSVar5[1].kind, kind == Identifier ||
              (bVar2 = LexerFacts::isKeyword(kind), bVar2)))) {
            uVar8 = *(undefined8 *)(pSVar5 + 1);
            pSVar6 = pSVar5[1].parent;
            pSVar5 = (SyntaxNode *)0x0;
            goto LAB_001c3fc1;
          }
          range = slang::syntax::SyntaxNode::sourceRange(pSVar5);
          addDiag(this,(DiagCode)0x200004,range);
        }
        lVar7 = lVar7 + 0x30;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  return;
}

Assistant:

void Preprocessor::applyProtectPragma(const PragmaDirectiveSyntax& pragma,
                                      SmallVectorBase<Token>& skippedTokens) {
    if (pragma.args.empty()) {
        Token last = pragma.getLastToken();
        addDiag(diag::ExpectedProtectKeyword, last.location() + last.rawText().length());
        return;
    }

    auto handle = [&](Token keyword, const PragmaExpressionSyntax* args) {
        auto text = keyword.valueText();
        if (auto it = pragmaProtectHandlers.find(text); it != pragmaProtectHandlers.end())
            (this->*(it->second))(keyword, args, skippedTokens);
        else if (!text.empty())
            addDiag(diag::UnknownProtectKeyword, keyword.range()) << text;
    };

    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            if (simple.value.kind == TokenKind::Identifier ||
                LexerFacts::isKeyword(simple.value.kind)) {
                handle(simple.value, nullptr);
                continue;
            }
        }
        else if (arg->kind == SyntaxKind::NameValuePragmaExpression) {
            auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
            handle(nvp.name, nvp.value);
            continue;
        }

        addDiag(diag::ExpectedProtectKeyword, arg->sourceRange());
    }
}